

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O0

void addToDecreasingHeap(HighsInt *n,HighsInt mx_n,vector<double,_std::allocator<double>_> *heap_v,
                        vector<int,_std::allocator<int>_> *heap_ix,double v,HighsInt ix)

{
  value_type vVar1;
  double dVar2;
  value_type vVar3;
  reference pvVar4;
  reference pvVar5;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  int in_ESI;
  int *in_RDI;
  value_type in_R8D;
  double in_XMM0_Qa;
  HighsInt pa_p;
  HighsInt cd_p;
  int local_34;
  int local_30;
  
  if (*in_RDI < in_ESI) {
    *in_RDI = *in_RDI + 1;
    local_30 = *in_RDI;
    while ((local_34 = local_30 / 2, 0 < local_34 &&
           (pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_34)
           , in_XMM0_Qa < *pvVar4))) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_34);
      vVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_30);
      *pvVar4 = vVar1;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)local_34);
      vVar3 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)local_30);
      *pvVar5 = vVar3;
      local_30 = local_34;
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_30);
    *pvVar4 = in_XMM0_Qa;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)local_30);
    *pvVar5 = in_R8D;
  }
  else {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,1);
    if (*pvVar4 <= in_XMM0_Qa && in_XMM0_Qa != *pvVar4) {
      local_34 = 1;
      for (local_30 = 2; local_30 <= *in_RDI; local_30 = local_30 * 2) {
        if (local_30 < *in_RDI) {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_30);
          dVar2 = *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RDX,(long)(local_30 + 1));
          if (*pvVar4 <= dVar2 && dVar2 != *pvVar4) {
            local_30 = local_30 + 1;
          }
        }
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_30);
        if (in_XMM0_Qa < *pvVar4 || in_XMM0_Qa == *pvVar4) break;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_30);
        vVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_34);
        *pvVar4 = vVar1;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)local_30);
        vVar3 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)local_34);
        *pvVar5 = vVar3;
        local_34 = local_30;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_34);
      *pvVar4 = in_XMM0_Qa;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)local_34);
      *pvVar5 = in_R8D;
    }
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,0);
  *pvVar5 = 1;
  return;
}

Assistant:

void addToDecreasingHeap(HighsInt& n, HighsInt mx_n, vector<double>& heap_v,
                         vector<HighsInt>& heap_ix, const double v,
                         const HighsInt ix) {
  HighsInt cd_p, pa_p;
  if (n < mx_n) {
    // The heap is not full so put the new value at the bottom of the
    // heap and let it rise up to its correct level.
    n++;
    cd_p = n;
    pa_p = cd_p / 2;
    for (;;) {
      if (pa_p > 0) {
        if (v < heap_v[pa_p]) {
          heap_v[cd_p] = heap_v[pa_p];
          heap_ix[cd_p] = heap_ix[pa_p];
          cd_p = pa_p;
          pa_p = pa_p / 2;
          continue;
        }
      }
      break;
    }
    heap_v[cd_p] = v;
    heap_ix[cd_p] = ix;
  } else if (v > heap_v[1]) {
    // The heap is full so replace the least value with the new value
    // and let it sink down to its correct level.
    pa_p = 1;
    cd_p = pa_p + pa_p;
    for (;;) {
      if (cd_p <= n) {
        if (cd_p < n) {
          if (heap_v[cd_p] > heap_v[cd_p + 1]) cd_p++;
        }
        if (v > heap_v[cd_p]) {
          heap_v[pa_p] = heap_v[cd_p];
          heap_ix[pa_p] = heap_ix[cd_p];
          pa_p = cd_p;
          cd_p = cd_p + cd_p;
          continue;
        }
      }
      break;
    }
    heap_v[pa_p] = v;
    heap_ix[pa_p] = ix;
  }
  // Set heap_ix[0]=1 to indicate that the values form a heap.
  heap_ix[0] = 1;
  return;
}